

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::java::GenerateGetBitMutableLocal_abi_cxx11_(int bitIndex)

{
  string *in_RDI;
  int in_stack_000000a4;
  string *in_stack_000000a8;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"mutable_",&local_31);
  anon_unknown_0::GenerateGetBitInternal(in_stack_000000a8,in_stack_000000a4);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return in_RDI;
}

Assistant:

std::string GenerateGetBitMutableLocal(int bitIndex) {
  return GenerateGetBitInternal("mutable_", bitIndex);
}